

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setSystemNoiseVariance
          (AttitudeQuaternionEKF *this,double gyro,double gyro_bias)

{
  bool bVar1;
  pointer peVar2;
  MatrixDynSize Q;
  Span<double,__1L> Q_span;
  MatrixDynSize aMStack_48 [40];
  Span<double,__1L> local_20;
  
  (this->m_params_qekf).gyroscope_noise_variance = gyro;
  (this->m_params_qekf).gyro_bias_noise_variance = gyro_bias;
  iDynTree::MatrixDynSize::MatrixDynSize(aMStack_48,this->m_state_size,this->m_state_size);
  prepareSystemNoiseCovarianceMatrix(this,aMStack_48);
  peVar2 = (pointer)iDynTree::MatrixDynSize::data();
  local_20.storage_.super_extent_type<_1L>.size_ = iDynTree::MatrixDynSize::capacity();
  local_20.storage_.data_ = peVar2;
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetSystemNoiseCovariance
                    (&this->super_DiscreteExtendedKalmanFilterHelper,&local_20);
  iDynTree::MatrixDynSize::~MatrixDynSize(aMStack_48);
  return bVar1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setSystemNoiseVariance(double gyro, double gyro_bias)
{
    m_params_qekf.gyroscope_noise_variance = gyro;
    m_params_qekf.gyro_bias_noise_variance = gyro_bias;

    iDynTree::MatrixDynSize Q = iDynTree::MatrixDynSize(m_state_size, m_state_size);
    prepareSystemNoiseCovarianceMatrix(Q);
    iDynTree::Span<double> Q_span(Q.data(), Q.capacity());
    bool ok = ekfSetSystemNoiseCovariance(Q_span);
    return ok;
}